

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

dropt_error parse_option_arg(dropt_context *context,parse_state *ps)

{
  bool bVar1;
  dropt_error local_1c;
  _Bool consumeNextArg;
  dropt_error err;
  parse_state *ps_local;
  dropt_context *context_local;
  
  bVar1 = false;
  if ((ps->option->arg_description != (dropt_char *)0x0) &&
     (ps->optionArgument == (dropt_char *)0x0)) {
    if ((ps->argsLeft < 1) || (*ps->argNext == (dropt_char *)0x0)) {
      if ((ps->option->attr & 4) == 0) {
        local_1c = 5;
        goto LAB_001040da;
      }
    }
    else {
      bVar1 = true;
      ps->optionArgument = *ps->argNext;
    }
  }
  local_1c = set_option_value(context,ps->option,ps->optionArgument);
  if ((((local_1c != 0) && ((ps->option->attr & 4) != 0)) && (bVar1)) &&
     (ps->optionArgument != (dropt_char *)0x0)) {
    bVar1 = false;
    ps->optionArgument = (dropt_char *)0x0;
    local_1c = set_option_value(context,ps->option,(dropt_char *)0x0);
  }
LAB_001040da:
  if ((local_1c == 0) && (bVar1)) {
    ps->argNext = ps->argNext + 1;
    ps->argsLeft = ps->argsLeft + -1;
  }
  return local_1c;
}

Assistant:

static dropt_error
parse_option_arg(dropt_context* context, parse_state* ps)
{
    dropt_error err;

    bool consumeNextArg = false;

    if (OPTION_TAKES_ARG(ps->option) && ps->optionArgument == NULL)
    {
        /* The option expects an argument, but none was specified with '='.
         * Try using the next item from the command-line.
         */
        if (ps->argsLeft > 0 && *(ps->argNext) != NULL)
        {
            consumeNextArg = true;
            ps->optionArgument = *(ps->argNext);
        }
        else if (!(ps->option->attr & dropt_attr_optional_val))
        {
            err = dropt_error_insufficient_arguments;
            goto exit;
        }
    }

    /* Even for options that don't ask for arguments, always parse and
     * consume an argument that was specified with '='.
     */
    err = set_option_value(context, ps->option, ps->optionArgument);

    if (   err != dropt_error_none
        && (ps->option->attr & dropt_attr_optional_val)
        && consumeNextArg
        && ps->optionArgument != NULL)
    {
        /* The option's handler didn't like the argument we fed it.  If the
         * argument was optional, try again without it.
         */
        consumeNextArg = false;
        ps->optionArgument = NULL;
        err = set_option_value(context, ps->option, NULL);
    }

exit:
    if (err == dropt_error_none && consumeNextArg)
    {
        ps->argNext++;
        ps->argsLeft--;
    }
    return err;
}